

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O0

void dec_vproc_put_frame(Mpp *mpp,MppFrame frame,MppBuffer buf,RK_S64 pts,RK_U32 err)

{
  uint uVar1;
  MppFrameImpl *pMVar2;
  RK_U32 RVar3;
  RK_U32 RVar4;
  RK_U32 RVar5;
  RK_S64 RVar6;
  void *pvVar7;
  __sighandler_t extraout_RDX;
  __sighandler_t extraout_RDX_00;
  __sighandler_t __handler;
  int __sig;
  MppFrameImpl *impl;
  MppFrame out;
  mpp_list *list;
  RK_S64 RStack_30;
  RK_U32 err_local;
  RK_S64 pts_local;
  MppBuffer buf_local;
  MppFrame frame_local;
  Mpp *mpp_local;
  MppFrameImpl **data;
  
  out = mpp->mFrmOut;
  impl = (MppFrameImpl *)0x0;
  list._4_4_ = err;
  RStack_30 = pts;
  pts_local = (RK_S64)buf;
  buf_local = frame;
  frame_local = mpp;
  mpp_frame_init(&impl);
  mpp_frame_copy(impl,buf_local);
  pMVar2 = impl;
  if (-1 < RStack_30) {
    impl->pts = RStack_30;
  }
  if (pts_local != 0) {
    impl->buffer = (MppBuffer)pts_local;
  }
  impl->errinfo = list._4_4_ | impl->errinfo;
  MppMutexCond::lock((MppMutexCond *)out);
  data = &impl;
  mpp_list::add_at_tail((mpp_list *)out,data,8);
  __sig = (int)data;
  *(int *)((long)frame_local + 0x28) = *(int *)((long)frame_local + 0x28) + 1;
  __handler = extraout_RDX;
  if ((vproc_debug & 0x80) != 0) {
    uVar1 = *(uint *)((long)frame_local + 0x28);
    RVar3 = mpp_frame_get_poc(impl);
    RVar6 = mpp_frame_get_pts(impl);
    RVar4 = mpp_frame_get_errinfo(buf_local);
    RVar5 = mpp_frame_get_discard(buf_local);
    pvVar7 = mpp_buffer_get_ptr_with_caller(pMVar2->buffer,"dec_vproc_put_frame");
    __sig = 0x35c665;
    _mpp_log_l(4,"mpp_dec_vproc","Output frame[%d]:poc %d, pts %lld, err 0x%x, dis %x, buf ptr %p\n"
               ,"dec_vproc_put_frame",(ulong)uVar1,(ulong)RVar3,RVar6,RVar4,RVar5,pvVar7);
    __handler = extraout_RDX_00;
  }
  MppMutexCond::signal((MppMutexCond *)out,__sig,__handler);
  MppMutexCond::unlock((MppMutexCond *)out);
  if (*(long *)((long)frame_local + 0xa8) != 0) {
    mpp_dec_callback(*(MppDec *)((long)frame_local + 0xa8),MPP_DEC_EVENT_ON_FRM_READY,impl);
  }
  return;
}

Assistant:

static void dec_vproc_put_frame(Mpp *mpp, MppFrame frame, MppBuffer buf, RK_S64 pts, RK_U32 err)
{
    mpp_list *list = mpp->mFrmOut;
    MppFrame out = NULL;
    MppFrameImpl *impl = NULL;

    mpp_frame_init(&out);
    mpp_frame_copy(out, frame);
    impl = (MppFrameImpl *)out;
    if (pts >= 0)
        impl->pts = pts;
    if (buf)
        impl->buffer = buf;

    impl->errinfo |= err;

    list->lock();
    list->add_at_tail(&out, sizeof(out));

    mpp->mFramePutCount++;
    vproc_dbg_out("Output frame[%d]:poc %d, pts %lld, err 0x%x, dis %x, buf ptr %p\n",
                  mpp->mFramePutCount, mpp_frame_get_poc(out), mpp_frame_get_pts(out),
                  mpp_frame_get_errinfo(frame), mpp_frame_get_discard(frame),
                  mpp_buffer_get_ptr(impl->buffer));
    list->signal();
    list->unlock();

    if (mpp->mDec)
        mpp_dec_callback(mpp->mDec, MPP_DEC_EVENT_ON_FRM_READY, out);
}